

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregateExecutorLocalState::~WindowAggregateExecutorLocalState
          (WindowAggregateExecutorLocalState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppEVar1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var2;
  
  (this->super_WindowExecutorBoundsState).super_WindowExecutorLocalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowAggregateExecutorLocalState_019cc748;
  this_00 = (this->filter_sel).selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->filter_executor).states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->filter_executor).expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  _Var2._M_head_impl =
       (this->aggregator_state).
       super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
       .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (WindowAggregatorState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_WindowAggregatorState + 8))();
  }
  (this->aggregator_state).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl =
       (WindowAggregatorState *)0x0;
  WindowExecutorBoundsState::~WindowExecutorBoundsState(&this->super_WindowExecutorBoundsState);
  operator_delete(this);
  return;
}

Assistant:

WindowAggregateExecutorLocalState(const WindowExecutorGlobalState &gstate, const WindowAggregator &aggregator)
	    : WindowExecutorBoundsState(gstate), filter_executor(gstate.executor.context) {

		auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
		aggregator_state = aggregator.GetLocalState(*gastate.gsink);

		// evaluate the FILTER clause and stuff it into a large mask for compactness and reuse
		auto filter_ref = gastate.filter_ref;
		if (filter_ref) {
			filter_executor.AddExpression(*filter_ref);
			filter_sel.Initialize(STANDARD_VECTOR_SIZE);
		}
	}